

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::parse(Reader *this,string *document,Value *root,bool collectComments)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  char *end;
  char *begin;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string documentCopy;
  bool collectComments_local;
  Value *root_local;
  string *document_local;
  Reader *this_local;
  
  documentCopy.field_2._M_local_buf[0xf] = collectComments;
  pcVar2 = (char *)std::__cxx11::string::data();
  lVar3 = std::__cxx11::string::data();
  lVar4 = std::__cxx11::string::capacity();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            ((string *)local_48,pcVar2,(char *)(lVar3 + lVar4),&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::swap<char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             &this->document_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  lVar3 = std::__cxx11::string::length();
  bVar1 = parse(this,pcVar2,pcVar2 + lVar3,root,(bool)(documentCopy.field_2._M_local_buf[0xf] & 1));
  std::__cxx11::string::~string((string *)local_48);
  return bVar1;
}

Assistant:

bool
Reader::parse(const std::string& document, Value& root, bool collectComments) {
  JSONCPP_STRING documentCopy(document.data(), document.data() + document.capacity());
  std::swap(documentCopy, document_);
  const char* begin = document_.c_str();
  const char* end = begin + document_.length();
  return parse(begin, end, root, collectComments);
}